

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O3

ErrCode __thiscall Regex::dumpTree(Regex *this,string *dump)

{
  Regex *pRVar1;
  Regex *this_00;
  
  if (1 < this->mState - STATE_PREPARED) {
    return kNotInitialized;
  }
  pRVar1 = (Regex *)&this->mRoot;
  do {
    do {
      this_00 = pRVar1;
      dumpElement(this_00,(Element *)this_00,dump);
      pRVar1 = (Regex *)(this_00->mRoot).mNext;
    } while (pRVar1 != (Regex *)0x0);
    while (pRVar1 = (Regex *)(this_00->mRoot).mParent, pRVar1 == (Regex *)0x0) {
      this_00 = *(Regex **)this_00;
      if (this_00 == (Regex *)0x0) {
        return kNoError;
      }
    }
  } while( true );
}

Assistant:

JetHead::ErrCode	Regex::dumpTree( std::string &dump )
{
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;

	Element *cur_node = &mRoot;
	
	while( cur_node != NULL )
	{
		dumpElement( cur_node, dump );
		
		if ( cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( cur_node->mParent == NULL )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return JetHead::kNoError;
}